

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.c
# Opt level: O2

upb_Map * upb_Map_DeepClone(upb_Map *map,upb_CType key_type,upb_CType value_type,
                           upb_MiniTable *map_entry_table,upb_Arena *arena)

{
  _Bool _Var1;
  upb_CType uVar2;
  upb_MapInsertStatus uVar3;
  upb_Map *map_00;
  upb_MiniTableField *f;
  upb_MiniTable *sub;
  size_t iter;
  upb_MessageValue val;
  upb_MessageValue key;
  size_t local_58;
  upb_MessageValue local_50;
  upb_MessageValue local_40;
  
  map_00 = _upb_Map_New(arena,(long)map->key_size,(long)map->val_size);
  if (map_00 != (upb_Map *)0x0) {
    local_58 = 0xffffffffffffffff;
    do {
      _Var1 = upb_Map_Next(map,&local_40,&local_50,&local_58);
      if (!_Var1) {
        return map_00;
      }
      f = upb_MiniTable_MapValue(map_entry_table);
      uVar2 = upb_MiniTableField_CType(f);
      if (uVar2 == kUpb_CType_Message) {
        sub = upb_MiniTable_GetSubMessageTable(map_entry_table,f);
      }
      else {
        sub = (upb_MiniTable *)0x0;
      }
      uVar2 = upb_MiniTableField_CType(f);
      _Var1 = upb_Clone_MessageValue(&local_50,uVar2,sub,arena);
    } while ((_Var1) &&
            (uVar3 = upb_Map_Insert(map_00,local_40,local_50,arena),
            uVar3 != kUpb_MapInsertStatus_OutOfMemory));
  }
  return (upb_Map *)0x0;
}

Assistant:

upb_Map* upb_Map_DeepClone(const upb_Map* map, upb_CType key_type,
                           upb_CType value_type,
                           const upb_MiniTable* map_entry_table,
                           upb_Arena* arena) {
  upb_Map* cloned_map = _upb_Map_New(arena, map->key_size, map->val_size);
  if (cloned_map == NULL) {
    return NULL;
  }
  upb_MessageValue key, val;
  size_t iter = kUpb_Map_Begin;
  while (upb_Map_Next(map, &key, &val, &iter)) {
    const upb_MiniTableField* value_field =
        upb_MiniTable_MapValue(map_entry_table);
    const upb_MiniTable* value_sub =
        upb_MiniTableField_CType(value_field) == kUpb_CType_Message
            ? upb_MiniTable_GetSubMessageTable(map_entry_table, value_field)
            : NULL;
    upb_CType value_field_type = upb_MiniTableField_CType(value_field);
    if (!upb_Clone_MessageValue(&val, value_field_type, value_sub, arena)) {
      return NULL;
    }
    if (!upb_Map_Set(cloned_map, key, val, arena)) {
      return NULL;
    }
  }
  return cloned_map;
}